

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O2

bool __thiscall CmdLineArgsParser::ParseBoolean(CmdLineArgsParser *this)

{
  WCHAR WVar1;
  undefined8 *puVar2;
  char16_t *pcVar3;
  
  WVar1 = *this->pszCurrentArg;
  if (((WVar1 != L'\0') && (WVar1 != L' ')) && (WVar1 != L'-')) {
    if (WVar1 == L':') {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = L"\':\' not expected with a boolean flag";
    }
    else {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = L"Invalid character after boolean flag";
    }
    *puVar2 = pcVar3;
    __cxa_throw(puVar2,&Exception::typeinfo,0);
  }
  return WVar1 != L'-';
}

Assistant:

bool
CmdLineArgsParser::ParseBoolean()
{
    if (CurChar() == ':')
    {
        throw Exception(_u("':' not expected with a boolean flag"));
    }
    else if (CurChar() != '-' && CurChar() != ' ' && CurChar() != 0)
    {
        throw Exception(_u("Invalid character after boolean flag"));
    }
    else
    {
        return (CurChar() != '-');
    }
}